

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O0

void map_print_some_keys(EditLine *el,el_action_t *map,wint_t first,wint_t last)

{
  char local_848 [8];
  char extrabuf [1024];
  char unparsbuf [1024];
  wchar_t local_40 [2];
  wchar_t lastbuf [2];
  wchar_t firstbuf [2];
  el_bindings_t *ep;
  el_bindings_t *bp;
  wint_t last_local;
  wint_t first_local;
  el_action_t *map_local;
  EditLine *el_local;
  
  lastbuf[1] = L'\0';
  local_40[1] = 0;
  local_40[0] = last;
  lastbuf[0] = first;
  if (map[first] == '\x1c') {
    if (first == last) {
      keymacro__decode_str(lastbuf,extrabuf + 0x3f8,0x400,"\"\"");
      fprintf((FILE *)el->el_outfile,"%-15s->  is undefined\n",extrabuf + 0x3f8);
    }
  }
  else {
    ep = (el->el_map).help;
    while( true ) {
      if ((el->el_map).help + (el->el_map).nfunc <= ep) {
        abort();
      }
      if (ep->func == (uint)map[first]) break;
      ep = ep + 1;
    }
    if (first == last) {
      keymacro__decode_str(lastbuf,extrabuf + 0x3f8,0x400,"\"\"");
      fprintf((FILE *)el->el_outfile,"%-15s->  %ls\n",extrabuf + 0x3f8,ep->name);
    }
    else {
      keymacro__decode_str(lastbuf,extrabuf + 0x3f8,0x400,"\"\"");
      keymacro__decode_str(local_40,local_848,0x400,"\"\"");
      fprintf((FILE *)el->el_outfile,"%-4s to %-7s->  %ls\n",extrabuf + 0x3f8,local_848,ep->name);
    }
  }
  return;
}

Assistant:

static void
map_print_some_keys(EditLine *el, el_action_t *map, wint_t first, wint_t last)
{
	el_bindings_t *bp, *ep;
	wchar_t firstbuf[2], lastbuf[2];
	char unparsbuf[EL_BUFSIZ], extrabuf[EL_BUFSIZ];

	firstbuf[0] = first;
	firstbuf[1] = 0;
	lastbuf[0] = last;
	lastbuf[1] = 0;
	if (map[first] == ED_UNASSIGNED) {
		if (first == last) {
			(void) keymacro__decode_str(firstbuf, unparsbuf,
			    sizeof(unparsbuf), STRQQ);
			(void) fprintf(el->el_outfile,
			    "%-15s->  is undefined\n", unparsbuf);
		}
		return;
	}
	ep = &el->el_map.help[el->el_map.nfunc];
	for (bp = el->el_map.help; bp < ep; bp++) {
		if (bp->func == map[first]) {
			if (first == last) {
				(void) keymacro__decode_str(firstbuf, unparsbuf,
				    sizeof(unparsbuf), STRQQ);
				(void) fprintf(el->el_outfile, "%-15s->  %ls\n",
				    unparsbuf, bp->name);
			} else {
				(void) keymacro__decode_str(firstbuf, unparsbuf,
				    sizeof(unparsbuf), STRQQ);
				(void) keymacro__decode_str(lastbuf, extrabuf,
				    sizeof(extrabuf), STRQQ);
				(void) fprintf(el->el_outfile,
				    "%-4s to %-7s->  %ls\n",
				    unparsbuf, extrabuf, bp->name);
			}
			return;
		}
	}
#ifdef MAP_DEBUG
	if (map == el->el_map.key) {
		(void) keymacro__decode_str(firstbuf, unparsbuf,
		    sizeof(unparsbuf), STRQQ);
		(void) fprintf(el->el_outfile,
		    "BUG!!! %s isn't bound to anything.\n", unparsbuf);
		(void) fprintf(el->el_outfile, "el->el_map.key[%d] == %d\n",
		    first, el->el_map.key[first]);
	} else {
		(void) keymacro__decode_str(firstbuf, unparsbuf,
		    sizeof(unparsbuf), STRQQ);
		(void) fprintf(el->el_outfile,
		    "BUG!!! %s isn't bound to anything.\n", unparsbuf);
		(void) fprintf(el->el_outfile, "el->el_map.alt[%d] == %d\n",
		    first, el->el_map.alt[first]);
	}
#endif
	EL_ABORT((el->el_errfile, "Error printing keys\n"));
}